

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

Property * __thiscall
soul::AST::Annotation::findProperty<char[7]>(Annotation *this,char (*name) [7])

{
  bool bVar1;
  UnqualifiedName *pUVar2;
  string_view local_50;
  reference local_40;
  Property *p;
  const_iterator __end3;
  const_iterator __begin3;
  vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
  *__range3;
  char (*name_local) [7];
  Annotation *this_local;
  
  __end3 = std::
           vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
           ::begin(&this->properties);
  p = (Property *)
      std::vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
      ::end(&this->properties);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_soul::AST::Annotation::Property_*,_std::vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>_>
                                *)&p);
    if (!bVar1) {
      return (Property *)0x0;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<const_soul::AST::Annotation::Property_*,_std::vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>_>
               ::operator*(&__end3);
    pUVar2 = pool_ref<soul::AST::UnqualifiedName>::operator->(&local_40->name);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,*name);
    bVar1 = Identifier::operator==(&pUVar2->identifier,local_50);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_soul::AST::Annotation::Property_*,_std::vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>_>
    ::operator++(&__end3);
  }
  return local_40;
}

Assistant:

const Property* findProperty (const StringType& name) const
        {
            for (auto& p : properties)
                if (p.name->identifier == name)
                    return std::addressof (p);

            return {};
        }